

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O1

void divide_subset_split<float,int>
               (size_t *ix_arr,size_t st,size_t end,size_t col_num,float *Xc,int *Xc_ind,
               int *Xc_indptr,double split_point,MissingAction missing_action,size_t *st_NA,
               size_t *end_NA,size_t *split_ix)

{
  ulong *puVar1;
  int *piVar2;
  int iVar3;
  long lVar4;
  bool bVar5;
  size_t *r;
  ulong uVar6;
  ulong *puVar7;
  size_t *psVar8;
  int *piVar9;
  size_t sVar10;
  ulong *puVar11;
  ulong *puVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  
  uVar16 = (ulong)Xc_indptr[col_num];
  uVar6 = (ulong)Xc_indptr[col_num + 1];
  if (Xc_indptr[col_num] == Xc_indptr[col_num + 1]) {
    sVar10 = end + 1;
    if (split_point < 0.0) {
      sVar10 = st;
    }
    psVar8 = split_ix;
    if (missing_action != Fail) {
      *st_NA = sVar10;
      psVar8 = end_NA;
    }
    *psVar8 = sVar10;
  }
  puVar1 = ix_arr + st;
  puVar12 = ix_arr + end + 1;
  uVar13 = (long)puVar12 - (long)puVar1 >> 3;
  puVar7 = puVar1;
  if (0 < (long)uVar13) {
    do {
      uVar19 = uVar13 >> 1;
      uVar17 = ~uVar19 + uVar13;
      uVar13 = uVar19;
      if (puVar7[uVar19] < (ulong)(long)Xc_ind[uVar16]) {
        puVar7 = puVar7 + uVar19 + 1;
        uVar13 = uVar17;
      }
    } while (0 < (long)uVar13);
  }
  uVar13 = uVar6 - 1;
  sVar10 = (long)puVar7 - (long)ix_arr >> 3;
  if (puVar7 <= puVar1) {
    sVar10 = st;
  }
  uVar17 = (ulong)Xc_ind[uVar6 - 1];
  puVar1 = ix_arr + end;
  if (split_point < 0.0) {
    sVar10 = st;
  }
  if (missing_action == Fail) {
    if (split_point < 0.0) {
      if ((puVar7 != puVar12) && (uVar6 != uVar16)) {
        while (uVar19 = *puVar7, uVar19 <= uVar17) {
          piVar2 = Xc_ind + uVar16;
          iVar3 = *piVar2;
          if (iVar3 == (int)uVar19) {
            if ((double)Xc[uVar16] <= split_point) {
              uVar14 = ix_arr[sVar10];
              ix_arr[sVar10] = uVar19;
              *puVar7 = uVar14;
              sVar10 = sVar10 + 1;
            }
            if ((puVar7 == puVar1) || (uVar16 == uVar13)) break;
            piVar9 = piVar2 + 1;
            puVar7 = puVar7 + 1;
            uVar16 = (long)((long)Xc_ind + (uVar6 * 4 - (long)piVar9)) >> 2;
            if (0 < (long)uVar16) {
              do {
                uVar19 = uVar16 >> 1;
                uVar14 = ~uVar19 + uVar16;
                uVar16 = uVar19;
                if ((ulong)(long)piVar9[uVar19] < *puVar7) {
                  piVar9 = piVar9 + uVar19 + 1;
                  uVar16 = uVar14;
                }
              } while (0 < (long)uVar16);
            }
LAB_00266eb0:
            uVar16 = (long)piVar9 - (long)Xc_ind >> 2;
          }
          else {
            if (iVar3 <= (int)uVar19) {
              piVar9 = piVar2 + 1;
              uVar16 = (long)((long)Xc_ind + (uVar6 * 4 - (long)(piVar2 + 1))) >> 2;
              while (0 < (long)uVar16) {
                uVar14 = uVar16 >> 1;
                uVar15 = ~uVar14 + uVar16;
                uVar16 = uVar14;
                if ((ulong)(long)piVar9[uVar14] < uVar19) {
                  piVar9 = piVar9 + uVar14 + 1;
                  uVar16 = uVar15;
                }
              }
              goto LAB_00266eb0;
            }
            puVar7 = puVar7 + 1;
            uVar19 = (long)puVar12 - (long)puVar7 >> 3;
            while (0 < (long)uVar19) {
              uVar14 = uVar19 >> 1;
              uVar15 = ~uVar14 + uVar19;
              uVar19 = uVar14;
              if (puVar7[uVar14] < (ulong)(long)iVar3) {
                puVar7 = puVar7 + uVar14 + 1;
                uVar19 = uVar15;
              }
            }
          }
          if ((puVar7 == puVar12) || (uVar16 == uVar6)) break;
        }
      }
    }
    else {
      while (puVar7 != puVar12) {
        if (uVar6 <= uVar16) goto LAB_002669da;
        piVar2 = Xc_ind + uVar16;
        iVar3 = *piVar2;
        uVar17 = *puVar7;
        if (iVar3 == (int)uVar17) {
          if ((double)Xc[uVar16] <= split_point) {
            uVar19 = ix_arr[sVar10];
            ix_arr[sVar10] = uVar17;
            *puVar7 = uVar19;
            sVar10 = sVar10 + 1;
          }
          if (((puVar7 < puVar1) && (puVar11 = puVar7 + 1, puVar11 <= puVar1)) && (uVar16 == uVar13)
             ) {
            do {
              uVar17 = ix_arr[sVar10];
              ix_arr[sVar10] = *puVar11;
              *puVar11 = uVar17;
              sVar10 = sVar10 + 1;
              puVar11 = puVar11 + 1;
            } while (puVar11 <= puVar1);
          }
          if ((uVar16 == uVar13) || (puVar7 == puVar1)) break;
          piVar9 = piVar2 + 1;
          puVar7 = puVar7 + 1;
          uVar16 = (long)((long)Xc_ind + (uVar6 * 4 - (long)piVar9)) >> 2;
          if (0 < (long)uVar16) {
            do {
              uVar17 = uVar16 >> 1;
              uVar19 = ~uVar17 + uVar16;
              uVar16 = uVar17;
              if ((ulong)(long)piVar9[uVar17] < *puVar7) {
                piVar9 = piVar9 + uVar17 + 1;
                uVar16 = uVar19;
              }
            } while (0 < (long)uVar16);
          }
LAB_002669ac:
          uVar16 = (long)piVar9 - (long)Xc_ind >> 2;
        }
        else {
          if (iVar3 <= (int)uVar17) {
            piVar9 = piVar2 + 1;
            uVar16 = (long)((long)Xc_ind + (uVar6 * 4 - (long)(piVar2 + 1))) >> 2;
            while (0 < (long)uVar16) {
              uVar19 = uVar16 >> 1;
              uVar14 = ~uVar19 + uVar16;
              uVar16 = uVar19;
              if ((ulong)(long)piVar9[uVar19] < uVar17) {
                piVar9 = piVar9 + uVar19 + 1;
                uVar16 = uVar14;
              }
            }
            goto LAB_002669ac;
          }
          for (; (puVar7 <= puVar1 && ((int)*puVar7 < iVar3)); puVar7 = puVar7 + 1) {
            uVar17 = ix_arr[sVar10];
            ix_arr[sVar10] = *puVar7;
            *puVar7 = uVar17;
            sVar10 = sVar10 + 1;
          }
        }
      }
    }
    goto LAB_00266ec9;
  }
  if (split_point < 0.0) {
    if ((puVar7 != puVar12) && (uVar6 != uVar16)) {
      bVar5 = false;
      uVar19 = uVar16;
      while (uVar14 = *puVar7, uVar14 <= uVar17) {
        piVar2 = Xc_ind + uVar19;
        iVar3 = *piVar2;
        if (iVar3 == (int)uVar14) {
          if (NAN(Xc[uVar19])) {
            bVar5 = true;
          }
          else if ((double)Xc[uVar19] <= split_point) {
            uVar15 = ix_arr[sVar10];
            ix_arr[sVar10] = uVar14;
            *puVar7 = uVar15;
            sVar10 = sVar10 + 1;
          }
          if ((puVar7 == puVar1) || (uVar19 == uVar13)) break;
          piVar9 = piVar2 + 1;
          puVar7 = puVar7 + 1;
          uVar19 = (long)((long)Xc_ind + (uVar6 * 4 - (long)piVar9)) >> 2;
          if (0 < (long)uVar19) {
            do {
              uVar14 = uVar19 >> 1;
              uVar15 = ~uVar14 + uVar19;
              uVar19 = uVar14;
              if ((ulong)(long)piVar9[uVar14] < *puVar7) {
                piVar9 = piVar9 + uVar14 + 1;
                uVar19 = uVar15;
              }
            } while (0 < (long)uVar19);
          }
LAB_00266b51:
          uVar19 = (long)piVar9 - (long)Xc_ind >> 2;
        }
        else {
          if (iVar3 <= (int)uVar14) {
            piVar9 = piVar2 + 1;
            uVar19 = (long)((long)Xc_ind + (uVar6 * 4 - (long)(piVar2 + 1))) >> 2;
            while (0 < (long)uVar19) {
              uVar15 = uVar19 >> 1;
              uVar18 = ~uVar15 + uVar19;
              uVar19 = uVar15;
              if ((ulong)(long)piVar9[uVar15] < uVar14) {
                piVar9 = piVar9 + uVar15 + 1;
                uVar19 = uVar18;
              }
            }
            goto LAB_00266b51;
          }
          puVar7 = puVar7 + 1;
          uVar14 = (long)puVar12 - (long)puVar7 >> 3;
          while (0 < (long)uVar14) {
            uVar15 = uVar14 >> 1;
            uVar18 = ~uVar15 + uVar14;
            uVar14 = uVar15;
            if (puVar7[uVar15] < (ulong)(long)iVar3) {
              puVar7 = puVar7 + uVar15 + 1;
              uVar14 = uVar18;
            }
          }
        }
        if ((puVar7 == puVar12) || (uVar19 == uVar6)) break;
      }
      goto LAB_00266b84;
    }
  }
  else if (puVar7 != puVar12) {
    bVar5 = false;
    uVar19 = uVar16;
    do {
      if (uVar6 <= uVar19) goto LAB_00266844;
      piVar2 = Xc_ind + uVar19;
      iVar3 = *piVar2;
      uVar14 = *puVar7;
      if (iVar3 == (int)uVar14) {
        if (NAN(Xc[uVar19])) {
          bVar5 = true;
        }
        else if ((double)Xc[uVar19] <= split_point) {
          uVar15 = ix_arr[sVar10];
          ix_arr[sVar10] = uVar14;
          *puVar7 = uVar15;
          sVar10 = sVar10 + 1;
        }
        if (((puVar7 < puVar1) && (puVar11 = puVar7 + 1, puVar11 <= puVar1)) && (uVar19 == uVar13))
        {
          do {
            uVar14 = ix_arr[sVar10];
            ix_arr[sVar10] = *puVar11;
            *puVar11 = uVar14;
            sVar10 = sVar10 + 1;
            puVar11 = puVar11 + 1;
          } while (puVar11 <= puVar1);
        }
        if ((uVar19 == uVar13) || (puVar7 == puVar1)) break;
        piVar9 = piVar2 + 1;
        puVar7 = puVar7 + 1;
        uVar19 = (long)((long)Xc_ind + (uVar6 * 4 - (long)piVar9)) >> 2;
        if (0 < (long)uVar19) {
          do {
            uVar14 = uVar19 >> 1;
            uVar15 = ~uVar14 + uVar19;
            uVar19 = uVar14;
            if ((ulong)(long)piVar9[uVar14] < *puVar7) {
              piVar9 = piVar9 + uVar14 + 1;
              uVar19 = uVar15;
            }
          } while (0 < (long)uVar19);
        }
LAB_00266805:
        uVar19 = (long)piVar9 - (long)Xc_ind >> 2;
      }
      else {
        if (iVar3 <= (int)uVar14) {
          piVar9 = piVar2 + 1;
          uVar19 = (long)((long)Xc_ind + (uVar6 * 4 - (long)(piVar2 + 1))) >> 2;
          while (0 < (long)uVar19) {
            uVar15 = uVar19 >> 1;
            uVar18 = ~uVar15 + uVar19;
            uVar19 = uVar15;
            if ((ulong)(long)piVar9[uVar15] < uVar14) {
              piVar9 = piVar9 + uVar15 + 1;
              uVar19 = uVar18;
            }
          }
          goto LAB_00266805;
        }
        for (; (puVar7 <= puVar1 && ((int)*puVar7 < iVar3)); puVar7 = puVar7 + 1) {
          uVar14 = ix_arr[sVar10];
          ix_arr[sVar10] = *puVar7;
          *puVar7 = uVar14;
          sVar10 = sVar10 + 1;
        }
      }
    } while (puVar7 != puVar12);
    goto LAB_00266b84;
  }
  bVar5 = false;
LAB_00266b84:
  *st_NA = sVar10;
  if (bVar5) {
    puVar7 = ix_arr + sVar10;
    if (puVar7 != puVar12) {
      uVar19 = (long)puVar12 - (long)puVar7 >> 3;
      lVar4 = 0x3f;
      if (uVar19 != 0) {
        for (; uVar19 >> lVar4 == 0; lVar4 = lVar4 + -1) {
        }
      }
      std::__introsort_loop<unsigned_long*,long,__gnu_cxx::__ops::_Iter_less_iter>
                (puVar7,puVar12,((uint)lVar4 ^ 0x3f) * 2 ^ 0x7e);
      std::__final_insertion_sort<unsigned_long*,__gnu_cxx::__ops::_Iter_less_iter>(puVar7,puVar12);
    }
    if ((puVar7 != puVar12) && (uVar6 != uVar16)) {
      while (uVar19 = *puVar7, uVar19 <= uVar17) {
        piVar2 = Xc_ind + uVar16;
        iVar3 = *piVar2;
        if (iVar3 == (int)uVar19) {
          if (NAN(Xc[uVar16])) {
            uVar14 = ix_arr[sVar10];
            ix_arr[sVar10] = uVar19;
            *puVar7 = uVar14;
            sVar10 = sVar10 + 1;
          }
          if ((puVar7 == puVar1) || (uVar16 == uVar13)) break;
          piVar9 = piVar2 + 1;
          puVar7 = puVar7 + 1;
          uVar16 = (long)((long)Xc_ind + (uVar6 * 4 - (long)piVar9)) >> 2;
          if (0 < (long)uVar16) {
            do {
              uVar19 = uVar16 >> 1;
              uVar14 = ~uVar19 + uVar16;
              uVar16 = uVar19;
              if ((ulong)(long)piVar9[uVar19] < *puVar7) {
                piVar9 = piVar9 + uVar19 + 1;
                uVar16 = uVar14;
              }
            } while (0 < (long)uVar16);
          }
LAB_00266d1e:
          uVar16 = (long)piVar9 - (long)Xc_ind >> 2;
        }
        else {
          if (iVar3 <= (int)uVar19) {
            piVar9 = piVar2 + 1;
            uVar16 = (long)((long)Xc_ind + (uVar6 * 4 - (long)(piVar2 + 1))) >> 2;
            while (0 < (long)uVar16) {
              uVar14 = uVar16 >> 1;
              uVar15 = ~uVar14 + uVar16;
              uVar16 = uVar14;
              if ((ulong)(long)piVar9[uVar14] < uVar19) {
                piVar9 = piVar9 + uVar14 + 1;
                uVar16 = uVar15;
              }
            }
            goto LAB_00266d1e;
          }
          puVar7 = puVar7 + 1;
          uVar19 = (long)puVar12 - (long)puVar7 >> 3;
          while (0 < (long)uVar19) {
            uVar14 = uVar19 >> 1;
            uVar15 = ~uVar14 + uVar19;
            uVar19 = uVar14;
            if ((puVar7 + uVar14 + 1)[-1] < (ulong)(long)iVar3) {
              puVar7 = puVar7 + uVar14 + 1;
              uVar19 = uVar15;
            }
          }
        }
        if ((puVar7 == puVar12) || (uVar16 == uVar6)) break;
      }
    }
  }
  *end_NA = sVar10;
  return;
LAB_00266844:
  for (; puVar7 <= puVar1; puVar7 = puVar7 + 1) {
    uVar19 = ix_arr[sVar10];
    ix_arr[sVar10] = *puVar7;
    *puVar7 = uVar19;
    sVar10 = sVar10 + 1;
  }
  goto LAB_00266b84;
LAB_002669da:
  for (; puVar7 <= puVar1; puVar7 = puVar7 + 1) {
    uVar16 = ix_arr[sVar10];
    ix_arr[sVar10] = *puVar7;
    *puVar7 = uVar16;
    sVar10 = sVar10 + 1;
  }
LAB_00266ec9:
  *split_ix = sVar10;
  return;
}

Assistant:

void divide_subset_split(size_t *restrict ix_arr, size_t st, size_t end, size_t col_num,
                         real_t Xc[], sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr, double split_point,
                         MissingAction missing_action, size_t &restrict st_NA, size_t &restrict end_NA, size_t &restrict split_ix) noexcept
{
    /* TODO: this is a mess, needs refactoring */
    /* TODO: when moving zeros, would be better to instead move by '>' (opposite as in here) */
    /* TODO: should create an extra version to go along with 'predict' that would
       add the range penalty right here to spare operations. */
    if (Xc_indptr[col_num] == Xc_indptr[col_num + 1])
    {
        if (missing_action == Fail)
        {
            split_ix = (0 <= split_point)? (end+1) : st;
        }

        else
        {
            st_NA  = (0 <= split_point)? (end+1) : st;
            end_NA = (0 <= split_point)? (end+1) : st;
        }

    }

    size_t st_col  = Xc_indptr[col_num];
    size_t end_col = Xc_indptr[col_num + 1] - 1;
    size_t curr_pos = st_col;
    size_t ind_end_col = Xc_ind[end_col];
    size_t temp;
    bool   move_zeros = 0 <= split_point;
    size_t *ptr_st = std::lower_bound(ix_arr + st, ix_arr + end + 1, Xc_ind[st_col]);

    if (move_zeros && ptr_st > ix_arr + st)
        st = ptr_st - ix_arr;

    if (missing_action == Fail)
    {
        if (move_zeros)
        {
            for (size_t *row = ptr_st;
                 row != ix_arr + end + 1;
                )
            {
                if (curr_pos >= end_col + 1)
                {
                    for (size_t *r = row; r <= ix_arr + end; r++)
                    {
                        temp       = ix_arr[st];
                        ix_arr[st] = *r;
                        *r         = temp;
                        st++;
                    }
                    break;
                }

                if (Xc_ind[curr_pos] == (sparse_ix)(*row))
                {
                    if (Xc[curr_pos] <= split_point)
                    {
                        temp       = ix_arr[st];
                        ix_arr[st] = *row;
                        *row       = temp;
                        st++;
                    }
                    if (curr_pos == end_col && row < ix_arr + end)
                    {
                        for (size_t *r = row + 1; r <= ix_arr + end; r++)
                        {
                            temp       = ix_arr[st];
                            ix_arr[st] = *r;
                            *r         = temp;
                            st++;
                        }
                    }
                    if (row == ix_arr + end || curr_pos == end_col) break;
                    curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
                }

                else
                {
                    if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                    {
                        while (row <= ix_arr + end && Xc_ind[curr_pos] > (sparse_ix)(*row))
                        {
                            temp       = ix_arr[st];
                            ix_arr[st] = *row;
                            *row       = temp;
                            st++; row++;
                        }
                    }

                    else
                        curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
                }
            }
        }

        else /* don't move zeros */
        {
            for (size_t *row = ptr_st;
                 row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
                )
            {
                if (Xc_ind[curr_pos] == (sparse_ix)(*row))
                {
                    if (Xc[curr_pos] <= split_point)
                    {
                        temp       = ix_arr[st];
                        ix_arr[st] = *row;
                        *row       = temp;
                        st++;
                    }
                    if (row == ix_arr + end || curr_pos == end_col) break;
                    curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
                }

                else
                {
                    if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                        row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
                    else
                        curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
                }
            }
        }

        split_ix = st;
    }

    else /* can have NAs */
    {

        bool has_NAs = false;
        if (move_zeros)
        {
            for (size_t *row = ptr_st;
                 row != ix_arr + end + 1;
                )
            {
                if (curr_pos >= end_col + 1)
                {
                    for (size_t *r = row; r <= ix_arr + end; r++)
                    {
                        temp       = ix_arr[st];
                        ix_arr[st] = *r;
                        *r         = temp;
                        st++;
                    }
                    break;
                }

                if (Xc_ind[curr_pos] == (sparse_ix)(*row))
                {
                    if (unlikely(std::isnan(Xc[curr_pos])))
                        has_NAs = true;
                    else if (Xc[curr_pos] <= split_point)
                    {
                        temp       = ix_arr[st];
                        ix_arr[st] = *row;
                        *row       = temp;
                        st++;
                    }
                    if (curr_pos == end_col && row < ix_arr + end)
                        for (size_t *r = row + 1; r <= ix_arr + end; r++)
                        {
                            temp       = ix_arr[st];
                            ix_arr[st] = *r;
                            *r         = temp;
                            st++;
                        }
                    if (row == ix_arr + end || curr_pos == end_col) break;
                    curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
                }

                else
                {
                    if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                    {
                        while (row <= ix_arr + end && Xc_ind[curr_pos] > (sparse_ix)(*row))
                        {
                            temp       = ix_arr[st];
                            ix_arr[st] = *row;
                            *row       = temp;
                            st++; row++;
                        }
                    }

                    else
                    {
                        curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
                    }
                }
            }
        }

        else /* don't move zeros */
        {
            for (size_t *row = ptr_st;
                 row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
                )
            {
                if (Xc_ind[curr_pos] == (sparse_ix)(*row))
                {
                    if (unlikely(std::isnan(Xc[curr_pos]))) has_NAs = true;
                    if (!std::isnan(Xc[curr_pos]) && Xc[curr_pos] <= split_point)
                    {
                        temp       = ix_arr[st];
                        ix_arr[st] = *row;
                        *row       = temp;
                        st++;
                    }
                    if (row == ix_arr + end || curr_pos == end_col) break;
                    curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
                }

                else
                {
                    if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                        row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
                    else
                        curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
                }
            }
        }


        st_NA = st;
        if (has_NAs)
        {
            curr_pos = st_col;
            std::sort(ix_arr + st, ix_arr + end + 1);
            for (size_t *row = ix_arr + st;
                 row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
                )
            {
                if (Xc_ind[curr_pos] == (sparse_ix)(*row))
                {
                    if (unlikely(std::isnan(Xc[curr_pos])))
                    {
                        temp       = ix_arr[st];
                        ix_arr[st] = *row;
                        *row       = temp;
                        st++;
                    }
                    if (row == ix_arr + end || curr_pos == end_col) break;
                    curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
                }

                else
                {
                    if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                        row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
                    else
                        curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
                }
            }
        }
        end_NA = st;

    }

}